

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O2

void wallet::AppendLastProcessedBlock(UniValue *entry,CWallet *wallet)

{
  long lVar1;
  long in_FS_OFFSET;
  string in_stack_fffffffffffffdb8;
  UniValue in_stack_fffffffffffffdd8;
  UniValue local_1c8;
  string local_170 [32];
  uint256 local_150;
  string local_130;
  UniValue local_110;
  string local_b8 [32];
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88 [16];
  UniValue lastprocessedblock;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  local_98 = local_88;
  local_90 = 0;
  local_88[0] = 0;
  UniValue::UniValue(&lastprocessedblock,VOBJ,in_stack_fffffffffffffdb8);
  std::__cxx11::string::~string((string *)&local_98);
  std::__cxx11::string::string<std::allocator<char>>
            (local_b8,"hash",(allocator<char> *)&stack0xfffffffffffffdbf);
  CWallet::GetLastBlockHash(&local_150,wallet);
  base_blob<256u>::GetHex_abi_cxx11_(&local_130,(base_blob<256u> *)&local_150);
  UniValue::
  UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (&local_110,&local_130);
  UniValue::pushKV(&lastprocessedblock,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdd8);
  UniValue::~UniValue(&local_110);
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string(local_b8);
  std::__cxx11::string::string<std::allocator<char>>
            (local_170,"height",(allocator<char> *)&local_150);
  local_130._M_dataplus._M_p._0_4_ = CWallet::GetLastBlockHeight(wallet);
  UniValue::UniValue<int,_int,_true>(&local_1c8,(int *)&local_130);
  UniValue::pushKV(&lastprocessedblock,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdd8);
  UniValue::~UniValue(&local_1c8);
  std::__cxx11::string::~string(local_170);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&stack0xfffffffffffffe18,"lastprocessedblock",(allocator<char> *)&local_130);
  UniValue::UniValue((UniValue *)&stack0xfffffffffffffdc0,&lastprocessedblock);
  UniValue::pushKV(entry,in_stack_fffffffffffffdb8,in_stack_fffffffffffffdd8);
  UniValue::~UniValue((UniValue *)&stack0xfffffffffffffdc0);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffe18);
  UniValue::~UniValue(&lastprocessedblock);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void AppendLastProcessedBlock(UniValue& entry, const CWallet& wallet)
{
    AssertLockHeld(wallet.cs_wallet);
    UniValue lastprocessedblock{UniValue::VOBJ};
    lastprocessedblock.pushKV("hash", wallet.GetLastBlockHash().GetHex());
    lastprocessedblock.pushKV("height", wallet.GetLastBlockHeight());
    entry.pushKV("lastprocessedblock", std::move(lastprocessedblock));
}